

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O1

ACES * __thiscall
AS_02::ACES::ACES_PDesc_to_MD
          (ACES *this,PictureDescriptor *PDesc,Dictionary *dict,
          RGBAEssenceDescriptor *EssenceDescriptor)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  MDD_t MVar10;
  int iVar11;
  undefined1 *puVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  *(ulong *)(EssenceDescriptor + 0xf8) = (ulong)PDesc->ContainerDuration;
  EssenceDescriptor[0x100] = (RGBAEssenceDescriptor)0x1;
  *(i32_t *)(EssenceDescriptor + 0xf0) = (PDesc->EditRate).Numerator;
  *(i32_t *)(EssenceDescriptor + 0xf4) = (PDesc->EditRate).Denominator;
  EssenceDescriptor[0x152] = (RGBAEssenceDescriptor)0x0;
  iVar4 = (PDesc->DataWindow).xMin;
  *(i32_t *)(EssenceDescriptor + 0x154) = ((PDesc->DataWindow).xMax - iVar4) + 1;
  iVar7 = (PDesc->DataWindow).yMin;
  *(i32_t *)(EssenceDescriptor + 0x158) = ((PDesc->DataWindow).yMax - iVar7) + 1;
  iVar8 = (PDesc->DisplayWindow).xMin;
  iVar2 = ((PDesc->DisplayWindow).xMax - iVar8) + 1;
  *(int *)(EssenceDescriptor + 0x18c) = iVar2;
  EssenceDescriptor[400] = (RGBAEssenceDescriptor)0x1;
  iVar3 = (PDesc->DisplayWindow).yMin;
  iVar6 = ((PDesc->DisplayWindow).yMax - iVar3) + 1;
  *(int *)(EssenceDescriptor + 0x184) = iVar6;
  EssenceDescriptor[0x188] = (RGBAEssenceDescriptor)0x1;
  *(int *)(EssenceDescriptor + 0x194) = iVar8 - iVar4;
  EssenceDescriptor[0x198] = (RGBAEssenceDescriptor)0x1;
  *(int *)(EssenceDescriptor + 0x19c) = iVar3 - iVar7;
  EssenceDescriptor[0x1a0] = (RGBAEssenceDescriptor)0x1;
  if (iVar6 != 0) {
    dVar13 = (double)iVar2 / (double)iVar6;
    iVar4 = 0;
    iVar7 = 0;
    iVar8 = 1;
    iVar3 = 1;
    do {
      iVar6 = iVar7;
      iVar11 = (int)(long)dVar13;
      iVar7 = iVar6 * iVar11 + iVar8;
      iVar2 = iVar3 * iVar11 + iVar4;
      dVar14 = (double)iVar11;
      if ((dVar13 == dVar14) && (!NAN(dVar13) && !NAN(dVar14))) break;
      dVar15 = 1.0 / (dVar13 - dVar14);
      dVar13 = (double)(~-(ulong)(dVar14 != dVar13) & (ulong)dVar13 |
                       -(ulong)(dVar14 != dVar13) & (ulong)dVar15);
      iVar4 = iVar3;
      iVar8 = iVar6;
      iVar3 = iVar2;
    } while (dVar15 <= 2147483647.0);
    *(int *)(EssenceDescriptor + 0x1b8) = iVar2;
    *(int *)(EssenceDescriptor + 0x1bc) = iVar7;
  }
  *(undefined2 *)(EssenceDescriptor + 0x1c2) = 0x100;
  MVar10 = (MDD_t)dict;
  puVar5 = (undefined8 *)ASDCP::Dictionary::Type(MVar10);
  local_48 = *puVar5;
  uStack_40 = puVar5[1];
  EssenceDescriptor[0x260] = (RGBAEssenceDescriptor)0x1;
  *(undefined8 *)(EssenceDescriptor + 0x261) = local_48;
  *(undefined8 *)(EssenceDescriptor + 0x269) = uStack_40;
  EssenceDescriptor[0x278] = (RGBAEssenceDescriptor)0x1;
  puVar5 = (undefined8 *)ASDCP::Dictionary::Type(MVar10);
  local_48 = *puVar5;
  uStack_40 = puVar5[1];
  EssenceDescriptor[0x1d0] = (RGBAEssenceDescriptor)0x1;
  *(undefined8 *)(EssenceDescriptor + 0x1d1) = local_48;
  *(undefined8 *)(EssenceDescriptor + 0x1d9) = uStack_40;
  EssenceDescriptor[0x1e8] = (RGBAEssenceDescriptor)0x1;
  pcVar1 = (PDesc->Channels).
           super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pcVar1 == 0x90) {
    iVar4 = std::__cxx11::string::compare((char *)pcVar1);
    if (iVar4 != 0) goto LAB_001512d9;
    pcVar1 = (PDesc->Channels).
             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(PDesc->Channels).
                           super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                   -0x5555555555555555)) {
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 1));
      if (iVar4 != 0) goto LAB_001512d9;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (2 < (ulong)(((long)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                     -0x5555555555555555)) {
        iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 2));
        if (iVar4 != 0) goto LAB_001512d9;
        puVar5 = (undefined8 *)ASDCP::Dictionary::Type(MVar10);
        local_48 = *puVar5;
        uStack_40 = puVar5[1];
        EssenceDescriptor[0x218] = (RGBAEssenceDescriptor)0x1;
        *(undefined8 *)(EssenceDescriptor + 0x219) = local_48;
        *(undefined8 *)(EssenceDescriptor + 0x221) = uStack_40;
        puVar12 = ACESPixelLayoutMonoscopicWOAlpha;
LAB_00151708:
        ASDCP::MXF::RGBALayout::RGBALayout((RGBALayout *)&local_48,puVar12);
        *(undefined8 *)(EssenceDescriptor + 0x398) = uStack_40;
        *(undefined8 *)(EssenceDescriptor + 0x3a0) = uStack_38;
        ASDCP::MXF::RGBALayout::~RGBALayout((RGBALayout *)&local_48);
        puVar12 = Kumu::RESULT_OK;
        goto LAB_0015172c;
      }
LAB_00151760:
      uVar9 = 2;
      goto LAB_0015177a;
    }
LAB_00151752:
    uVar9 = 1;
  }
  else {
LAB_001512d9:
    pcVar1 = (PDesc->Channels).
             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((long)(PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 == 0xc0) {
      iVar4 = std::__cxx11::string::compare((char *)pcVar1);
      if (iVar4 != 0) goto LAB_001513a8;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 2) goto LAB_00151752;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 1));
      if (iVar4 != 0) goto LAB_001513a8;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 3) goto LAB_00151760;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 2));
      if (iVar4 != 0) goto LAB_001513a8;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (3 < (ulong)(((long)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                     -0x5555555555555555)) {
        iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 3));
        if (iVar4 == 0) {
          puVar5 = (undefined8 *)ASDCP::Dictionary::Type(MVar10);
          local_48 = *puVar5;
          uStack_40 = puVar5[1];
          EssenceDescriptor[0x218] = (RGBAEssenceDescriptor)0x1;
          *(undefined8 *)(EssenceDescriptor + 0x219) = local_48;
          *(undefined8 *)(EssenceDescriptor + 0x221) = uStack_40;
          puVar12 = ACESPixelLayoutMonoscopicWAlpha;
          goto LAB_00151708;
        }
        goto LAB_001513a8;
      }
LAB_0015176e:
      uVar9 = 3;
      goto LAB_0015177a;
    }
LAB_001513a8:
    pcVar1 = (PDesc->Channels).
             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((long)(PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 == 0x120) {
      iVar4 = std::__cxx11::string::compare((char *)pcVar1);
      if (iVar4 != 0) goto LAB_001514e7;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 2) goto LAB_00151752;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 1));
      if (iVar4 != 0) goto LAB_001514e7;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 3) goto LAB_00151760;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 2));
      if (iVar4 != 0) goto LAB_001514e7;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 4) goto LAB_0015176e;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 3));
      if (iVar4 != 0) goto LAB_001514e7;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 5) goto LAB_00151781;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 4));
      if (iVar4 != 0) goto LAB_001514e7;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (5 < (ulong)(((long)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                     -0x5555555555555555)) {
        iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 5));
        if (iVar4 == 0) {
          puVar12 = Kumu::RESULT_NOTIMPL;
          goto LAB_0015172c;
        }
        goto LAB_001514e7;
      }
    }
    else {
LAB_001514e7:
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar12 = Kumu::RESULT_NOTIMPL;
      if ((long)(PDesc->Channels).
                super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 != 0x180) {
LAB_0015172c:
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar12);
        return this;
      }
      iVar4 = std::__cxx11::string::compare((char *)pcVar1);
      if (iVar4 != 0) goto LAB_0015172c;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 2) goto LAB_00151752;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 1));
      if (iVar4 != 0) goto LAB_0015172c;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 3) goto LAB_00151760;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 2));
      if (iVar4 != 0) goto LAB_0015172c;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 4) goto LAB_0015176e;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 3));
      if (iVar4 != 0) goto LAB_0015172c;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(PDesc->Channels).
                         super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                 -0x5555555555555555) < 5) goto LAB_00151781;
      iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 4));
      if (iVar4 != 0) goto LAB_0015172c;
      pcVar1 = (PDesc->Channels).
               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (5 < (ulong)(((long)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                     -0x5555555555555555)) {
        iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 5));
        if (iVar4 != 0) goto LAB_0015172c;
        pcVar1 = (PDesc->Channels).
                 super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (6 < (ulong)(((long)(PDesc->Channels).
                               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                       -0x5555555555555555)) {
          iVar4 = std::__cxx11::string::compare((char *)(pcVar1 + 6));
          if (iVar4 == 0) {
            pcVar1 = (PDesc->Channels).
                     super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(PDesc->Channels).
                               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                       -0x5555555555555555) < 8) {
              uVar9 = 7;
              goto LAB_0015177a;
            }
            std::__cxx11::string::compare((char *)(pcVar1 + 7));
          }
          goto LAB_0015172c;
        }
        uVar9 = 6;
        goto LAB_0015177a;
      }
    }
    uVar9 = 5;
  }
LAB_0015177a:
  do {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
LAB_00151781:
    uVar9 = 4;
  } while( true );
}

Assistant:

AS_02::Result_t AS_02::ACES::ACES_PDesc_to_MD(const PictureDescriptor &PDesc, const ASDCP::Dictionary &dict, ASDCP::MXF::RGBAEssenceDescriptor &EssenceDescriptor)
{

  EssenceDescriptor.ContainerDuration = PDesc.ContainerDuration;
  EssenceDescriptor.SampleRate = PDesc.EditRate;
  EssenceDescriptor.FrameLayout = 0x00;
  EssenceDescriptor.StoredWidth = PDesc.DataWindow.xMax - PDesc.DataWindow.xMin + 1;
  EssenceDescriptor.StoredHeight = PDesc.DataWindow.yMax - PDesc.DataWindow.yMin + 1;
  EssenceDescriptor.DisplayWidth = PDesc.DisplayWindow.xMax - PDesc.DisplayWindow.xMin + 1;
  EssenceDescriptor.DisplayHeight = PDesc.DisplayWindow.yMax - PDesc.DisplayWindow.yMin + 1;
  EssenceDescriptor.DisplayXOffset = PDesc.DisplayWindow.xMin - PDesc.DataWindow.xMin;
  EssenceDescriptor.DisplayYOffset = PDesc.DisplayWindow.yMin - PDesc.DataWindow.yMin;
  ASDCP::Rational aspect_ratio(EssenceDescriptor.DisplayWidth, EssenceDescriptor.DisplayHeight);
  if(aspect_ratio.Denominator != 0)  EssenceDescriptor.AspectRatio = AS_02::ConvertToRational(aspect_ratio.Quotient());
  EssenceDescriptor.AlphaTransparency = 0x00;
  EssenceDescriptor.ColorPrimaries = dict.ul(MDD_ColorPrimaries_ACES);
  EssenceDescriptor.TransferCharacteristic = dict.ul(MDD_TransferCharacteristic_linear);
  if(PDesc.Channels.size() == 3 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithoutAlpha); //Picture Essence Coding Label per 2065-5 section 8.2
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWOAlpha);
  }
  else if(PDesc.Channels.size() == 4 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithAlpha); //Picture Essence Coding Label per 2065-5
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWAlpha);
  }
  else if(PDesc.Channels.size() == 6 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R" &&
                            PDesc.Channels.at(3).name == "left.B" && PDesc.Channels.at(4).name == "left.G" && PDesc.Channels.at(5).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else if(PDesc.Channels.size() == 8 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R" &&
                            PDesc.Channels.at(4).name == "left.A" && PDesc.Channels.at(5).name == "left.B" && PDesc.Channels.at(6).name == "left.G" && PDesc.Channels.at(7).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else
  {
    return RESULT_NOTIMPL;
  }
  return RESULT_OK;
}